

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphelq2d.cpp
# Opt level: O3

int __thiscall TPZGraphElQ2d::NPoints(TPZGraphElQ2d *this,TPZGraphNode *n)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  uVar1 = TPZGraphEl::ConnectNum(&this->super_TPZGraphEl,n);
  uVar2 = 1;
  if (3 < uVar1) {
    bVar3 = (byte)((this->super_TPZGraphEl).fGraphMesh)->fResolution;
    if (uVar1 - 4 < 4) {
      uVar2 = ~(-1 << (bVar3 & 0x1f));
    }
    else if (uVar1 == 8) {
      uVar2 = ~(-1 << (bVar3 & 0x1f));
      uVar2 = uVar2 * uVar2;
    }
    else {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

int TPZGraphElQ2d::NPoints(TPZGraphNode *n)
{
	int in = ConnectNum(n);
	int res = fGraphMesh->Res();
	switch(in)
	{
		case 0:
		case 1:
		case 2:
		case 3:
			return(1);
		case 4:
		case 5:
		case 6:
		case 7:
			return((1 << res)-1);
		case 8:
		{
			int a = ((1 << res)-1);
			return(a*a);
		}
	};
	return(0);
}